

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testInit(XFBCaptureUnsizedArrayTest *this)

{
  GLuint stage;
  STAGES SVar1;
  testCase test_case;
  value_type local_1c;
  
  for (SVar1 = COMPUTE; SVar1 != STAGE_MAX; SVar1 = SVar1 + VERTEX) {
    if ((((SVar1 & TESS_EVAL) != COMPUTE) && (SVar1 != TESS_EVAL)) && (SVar1 != FRAGMENT)) {
      local_1c.m_stage = SVar1;
      std::
      vector<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_1c);
    }
  }
  return;
}

Assistant:

void XFBCaptureUnsizedArrayTest::testInit()
{
	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		/* Not aplicable for */
		if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::FRAGMENT == stage) ||
			(Utils::Shader::GEOMETRY == stage) || (Utils::Shader::TESS_EVAL == stage))
		{
			continue;
		}

		testCase test_case = { (Utils::Shader::STAGES)stage };

		m_test_cases.push_back(test_case);
	}
}